

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  int status;
  uint uVar2;
  lua_State *L;
  
  pcVar1 = *argv;
  if (pcVar1 == (char *)0x0) {
    argv = empty_argv;
  }
  else if (*pcVar1 != '\0') {
    progname = pcVar1;
  }
  L = luaL_newstate();
  if (L == (lua_State *)0x0) {
    l_message("cannot create state: not enough memory");
    uVar2 = 1;
  }
  else {
    smain_0 = argv;
    smain_1 = argc;
    status = lua_cpcall(L,pmain,(void *)0x0);
    report(L,status);
    lua_close(L);
    uVar2 = (uint)(0 < smain_2 || status != 0);
  }
  return uVar2;
}

Assistant:

int main(int argc, char **argv)
{
  int status;
  lua_State *L;
  if (!argv[0]) argv = empty_argv; else if (argv[0][0]) progname = argv[0];
  L = lua_open();
  if (L == NULL) {
    l_message("cannot create state: not enough memory");
    return EXIT_FAILURE;
  }
  smain.argc = argc;
  smain.argv = argv;
  status = lua_cpcall(L, pmain, NULL);
  report(L, status);
  lua_close(L);
  return (status || smain.status > 0) ? EXIT_FAILURE : EXIT_SUCCESS;
}